

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
DomainIteratorCore::hasNext(DomainIteratorCore *this)

{
  Entry *pEVar1;
  Entry *pEVar2;
  bool bVar3;
  
  pEVar2 = (this->_base)._next;
  pEVar1 = (this->_base)._last;
  if (pEVar2 == pEVar1) {
    return false;
  }
  do {
    bVar3 = ((pEVar2->field_0)._infoData & 1U) == 0 &&
            (uint)(pEVar2->field_0)._infoData >> 2 == (this->_base)._timestamp;
    if (bVar3) {
      return bVar3;
    }
    pEVar2 = pEVar2 + 1;
    (this->_base)._next = pEVar2;
  } while (pEVar2 != pEVar1);
  return bVar3;
}

Assistant:

inline bool hasNext() { return _base.hasNext(); }